

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

DynamicTypeHandler * __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::
ConvertToTypeWithItemAttributes
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance)

{
  bool bVar1;
  ES5ArrayTypeHandlerBase<unsigned_short> *pEVar2;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar3;
  
  bVar1 = JavascriptArray::IsNonES5Array(instance);
  if (bVar1) {
    pEVar2 = ConvertToES5ArrayType(this,instance);
    return (DynamicTypeHandler *)pEVar2;
  }
  pDVar3 = ConvertToDictionaryType(this,instance);
  return &pDVar3->super_DynamicTypeHandler;
}

Assistant:

DynamicTypeHandler* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToTypeWithItemAttributes(DynamicObject* instance)
    {
        return JavascriptArray::IsNonES5Array(instance) ?
            ConvertToES5ArrayType(instance) : ConvertToDictionaryType(instance);
    }